

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

void bitset_container_add_from_range
               (bitset_container_t *bitset,uint32_t min,uint32_t max,uint16_t step)

{
  uint64_t *puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  undefined6 in_register_0000000a;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar21;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  
  iVar5 = (int)CONCAT62(in_register_0000000a,step);
  uVar9 = CONCAT62(in_register_0000000a,step) & 0xffffffff;
  if (iVar5 != 0) {
    uVar8 = CONCAT44(0,min);
    if ((int)(0x40 % uVar9) == 0) {
      uVar4 = 0;
      if ((uint)(uVar8 % uVar9) < 0x40) {
        uVar12 = CONCAT62(0,step);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar12;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar8;
        lVar7 = (1 - uVar8 / uVar12) * uVar12;
        uVar4 = lVar7 + uVar8;
        uVar3 = 0x40;
        if (0x40 < uVar4) {
          uVar3 = uVar4;
        }
        uVar3 = uVar3 - lVar7;
        uVar4 = (ulong)(uVar3 != uVar8);
        uVar4 = (uVar3 - (uVar8 + uVar4)) / uVar12 + uVar4;
        lVar7 = SUB168(auVar18 % auVar20,0);
        lVar21 = uVar12 + SUB164(auVar18 % auVar20,0);
        auVar15._8_4_ = (int)uVar4;
        auVar15._0_8_ = uVar4;
        auVar15._12_4_ = (int)(uVar4 >> 0x20);
        uVar8 = 0xfffffffffffffffe;
        auVar14 = ZEXT816(0);
        do {
          auVar20 = auVar14;
          auVar14._8_8_ = 1L << lVar21;
          auVar14._0_8_ = 1L << lVar7;
          auVar14 = auVar14 | auVar20;
          lVar7 = lVar7 + (ulong)((uint)step * 2);
          lVar21 = lVar21 + (ulong)((uint)step * 2);
          uVar8 = uVar8 + 2;
        } while ((uVar4 & 0xfffffffffffffffe) != uVar8);
        auVar17._8_4_ = (int)uVar8;
        auVar17._0_8_ = uVar8;
        auVar17._12_4_ = (int)(uVar8 >> 0x20);
        auVar15 = auVar15 ^ _DAT_001332e0;
        auVar18 = (auVar17 | _DAT_001332d0) ^ _DAT_001332e0;
        iVar2 = -(uint)(auVar15._0_4_ < auVar18._0_4_);
        iVar23 = -(uint)(auVar15._4_4_ < auVar18._4_4_);
        iVar24 = -(uint)(auVar15._8_4_ < auVar18._8_4_);
        iVar25 = -(uint)(auVar15._12_4_ < auVar18._12_4_);
        auVar26._4_4_ = iVar2;
        auVar26._0_4_ = iVar2;
        auVar26._8_4_ = iVar24;
        auVar26._12_4_ = iVar24;
        iVar2 = -(uint)(auVar18._4_4_ == auVar15._4_4_);
        iVar24 = -(uint)(auVar18._12_4_ == auVar15._12_4_);
        auVar16._4_4_ = iVar2;
        auVar16._0_4_ = iVar2;
        auVar16._8_4_ = iVar24;
        auVar16._12_4_ = iVar24;
        auVar19._4_4_ = iVar23;
        auVar19._0_4_ = iVar23;
        auVar19._8_4_ = iVar25;
        auVar19._12_4_ = iVar25;
        auVar19 = auVar19 | auVar16 & auVar26;
        auVar20 = ~auVar19 & auVar14 | auVar20 & auVar19;
        uVar4 = auVar20._8_8_ | auVar20._0_8_;
      }
      uVar6 = min >> 6;
      uVar11 = max - 1 >> 6;
      bitset->cardinality = (int32_t)((iVar5 + max + ~min) / uVar9);
      uVar9 = -1L << ((byte)min & 0x3f);
      if (uVar6 == uVar11) {
        bVar10 = -(char)max;
        bitset->words[uVar6] =
             bitset->words[uVar6] | (uVar9 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f) & uVar4;
      }
      else {
        puVar1 = bitset->words;
        puVar1[uVar6] = uVar9 & uVar4;
        auVar18 = _DAT_001332e0;
        auVar20 = _DAT_001332d0;
        if (uVar6 + 1 < uVar11) {
          lVar7 = (ulong)uVar11 + (long)(int)~uVar6 + -1;
          auVar13._8_4_ = (int)lVar7;
          auVar13._0_8_ = lVar7;
          auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar9 = 0;
          auVar13 = auVar13 ^ _DAT_001332e0;
          do {
            auVar22._8_4_ = (int)uVar9;
            auVar22._0_8_ = uVar9;
            auVar22._12_4_ = (int)(uVar9 >> 0x20);
            auVar14 = (auVar22 | auVar20) ^ auVar18;
            if ((bool)(~(auVar14._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar14._0_4_ ||
                        auVar13._4_4_ < auVar14._4_4_) & 1)) {
              puVar1[(ulong)uVar6 + uVar9 + 1] = uVar4;
            }
            if ((auVar14._12_4_ != auVar13._12_4_ || auVar14._8_4_ <= auVar13._8_4_) &&
                auVar14._12_4_ <= auVar13._12_4_) {
              puVar1[(ulong)uVar6 + uVar9 + 2] = uVar4;
            }
            uVar9 = uVar9 + 2;
          } while (((long)(int)~uVar6 + (ulong)uVar11 + 1 & 0xfffffffffffffffe) != uVar9);
        }
        bVar10 = -(char)max;
        puVar1[uVar11] = (uVar4 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f);
      }
    }
    else if (min < max) {
      puVar1 = bitset->words;
      iVar2 = bitset->cardinality;
      do {
        uVar4 = (ulong)((uint)(uVar8 >> 3) & 0x1ff8);
        uVar9 = *(ulong *)((long)puVar1 + uVar4);
        uVar12 = uVar9 | 1L << (uVar8 & 0x3f);
        iVar2 = iVar2 + (int)((uVar9 ^ uVar12) >> ((byte)uVar8 & 0x3f));
        *(ulong *)((long)puVar1 + uVar4) = uVar12;
        uVar6 = (int)uVar8 + iVar5;
        uVar8 = (ulong)uVar6;
      } while (uVar6 < max);
      bitset->cardinality = iVar2;
    }
  }
  return;
}

Assistant:

void bitset_container_add_from_range(bitset_container_t *bitset, uint32_t min,
                                     uint32_t max, uint16_t step) {
    if (step == 0) return;   // refuse to crash
    if ((64 % step) == 0) {  // step divides 64
        uint64_t mask = 0;   // construct the repeated mask
        for (uint32_t value = (min % step); value < 64; value += step) {
            mask |= ((uint64_t)1 << value);
        }
        uint32_t firstword = min / 64;
        uint32_t endword = (max - 1) / 64;
        bitset->cardinality = (max - min + step - 1) / step;
        if (firstword == endword) {
            bitset->words[firstword] |=
                mask & (((~UINT64_C(0)) << (min % 64)) &
                        ((~UINT64_C(0)) >> ((~max + 1) % 64)));
            return;
        }
        bitset->words[firstword] = mask & ((~UINT64_C(0)) << (min % 64));
        for (uint32_t i = firstword + 1; i < endword; i++)
            bitset->words[i] = mask;
        bitset->words[endword] = mask & ((~UINT64_C(0)) >> ((~max + 1) % 64));
    } else {
        for (uint32_t value = min; value < max; value += step) {
            bitset_container_add(bitset, value);
        }
    }
}